

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

find_result __thiscall
unodb::detail::
basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::find_child(basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
             *this,node_type type,byte key_byte)

{
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  kVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint8_t key_int_byte;
  uint uVar7;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *pkVar8;
  key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *pkVar9;
  undefined7 in_register_00000031;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  find_result fVar12;
  
  switch(CONCAT71(in_register_00000031,type) & 0xffffffff) {
  case 0:
    __assert_fail("type != node_type::LEAF",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x391,
                  "find_result unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::find_child(node_type, std::byte) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  case 1:
    auVar10[1] = key_byte;
    auVar10[0] = key_byte;
    auVar10[2] = key_byte;
    auVar10[3] = key_byte;
    auVar10[4] = key_byte;
    auVar10[5] = key_byte;
    auVar10[6] = key_byte;
    auVar10[7] = key_byte;
    auVar10[8] = key_byte;
    auVar10[9] = key_byte;
    auVar10[10] = key_byte;
    auVar10[0xb] = key_byte;
    auVar10[0xc] = key_byte;
    auVar10[0xd] = key_byte;
    auVar10[0xe] = key_byte;
    auVar10[0xf] = key_byte;
    auVar3 = vpcmpeqb_avx(auVar10,ZEXT416(*(uint *)&this->field_0x24));
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) &
            ~(-1 << ((this->children_count).value.super___atomic_base<unsigned_char>._M_i & 0x1f));
    uVar2 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    uVar4 = CONCAT31((int3)(-(uint)(uVar7 == 0) >> 8),(byte)-(uint)(uVar7 == 0) | (byte)uVar2);
    pkVar8 = (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
              *)(&this[1].super_header_type.m_lock.version + uVar2);
    break;
  case 2:
    auVar11[1] = key_byte;
    auVar11[0] = key_byte;
    auVar11[2] = key_byte;
    auVar11[3] = key_byte;
    auVar11[4] = key_byte;
    auVar11[5] = key_byte;
    auVar11[6] = key_byte;
    auVar11[7] = key_byte;
    auVar11[8] = key_byte;
    auVar11[9] = key_byte;
    auVar11[10] = key_byte;
    auVar11[0xb] = key_byte;
    auVar11[0xc] = key_byte;
    auVar11[0xd] = key_byte;
    auVar11[0xe] = key_byte;
    auVar11[0xf] = key_byte;
    auVar3._0_8_ = this[1].super_header_type.m_lock.read_lock_count;
    auVar3._8_8_ = this[1].super_header_type.m_lock.obsoleter_thread;
    auVar3 = vpcmpeqb_avx(auVar11,auVar3);
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) &
            ~(-1 << ((this->children_count).value.super___atomic_base<unsigned_char>._M_i & 0x1f));
    uVar2 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    uVar4 = CONCAT31((int3)(-(uint)(uVar7 == 0) >> 8),(byte)-(uint)(uVar7 == 0) | (byte)uVar2);
    pkVar8 = &this[1].k_prefix + uVar2;
    break;
  case 3:
    uVar6 = 0xff;
    pkVar9 = (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
              *)0x0;
    if ((&this->field_0x21)[key_byte] != 0xff) {
      uVar6 = (ulong)key_byte;
      pkVar9 = (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                *)(&this[8].super_header_type.m_lock.version + (byte)(&this->field_0x21)[key_byte]);
    }
    goto LAB_00209506;
  case 4:
    pkVar9 = (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
              *)(&this[1].super_header_type.m_lock.version + key_byte);
    kVar1 = *pkVar9;
    iVar5 = -(uint)(kVar1 == (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                              )0x0);
    uVar6 = (ulong)CONCAT31((int3)((uint)iVar5 >> 8),(byte)iVar5 | key_byte);
    if (kVar1 == (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                  )0x0) {
      pkVar9 = (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                *)0x0;
    }
    goto LAB_00209506;
  default:
    basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
    ::find_child();
  }
  uVar6 = (ulong)uVar4;
  pkVar9 = (key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
            *)0x0;
  if (uVar7 != 0) {
    pkVar9 = pkVar8;
  }
LAB_00209506:
  fVar12.second =
       (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)pkVar9
  ;
  fVar12._0_8_ = uVar6;
  return fVar12;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr find_result find_child(
      node_type type, std::byte key_byte) noexcept {
    UNODB_DETAIL_ASSERT(type != node_type::LEAF);
    switch (type) {
      case node_type::I4:
        return static_cast<inode4_type *>(this)->find_child(key_byte);
      case node_type::I16:
        return static_cast<inode16_type *>(this)->find_child(key_byte);
      case node_type::I48:
        return static_cast<inode48_type *>(this)->find_child(key_byte);
      case node_type::I256:
        return static_cast<inode256_type *>(this)->find_child(key_byte);
        // LCOV_EXCL_START
      case node_type::LEAF:
        UNODB_DETAIL_CANNOT_HAPPEN();
    }
    UNODB_DETAIL_CANNOT_HAPPEN();
    // LCOV_EXCL_STOP
  }